

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O2

_Bool tval_is_melee_weapon(object *obj)

{
  return (byte)(obj->tval - 6) < 4;
}

Assistant:

bool tval_is_melee_weapon(const struct object *obj)
{
	switch (obj->tval) {
		case TV_SWORD:
		case TV_HAFTED:
		case TV_POLEARM:
		case TV_DIGGING:
			return true;
		default:
			return false;
	}
}